

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

void replace_positional(string *fmt,string *from,string *to)

{
  ulong uVar1;
  
  for (uVar1 = std::__cxx11::string::find((char *)fmt,(ulong)(from->_M_dataplus)._M_p,0);
      uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find
                        ((char *)fmt,(ulong)(from->_M_dataplus)._M_p,uVar1 + to->_M_string_length))
  {
    std::__cxx11::string::replace
              ((ulong)fmt,uVar1,(char *)from->_M_string_length,(ulong)(to->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

static void replace_positional (
  std::string& fmt,
  const std::string& from,
  const std::string& to)
{
  std::string::size_type pos = 0;
  while ((pos = fmt.find (from, pos)) != std::string::npos)
  {
    fmt.replace (pos, from.length (), to);
    pos += to.length ();
  }
}